

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

bool __thiscall GlobOpt::DoFieldCopyProp(GlobOpt *this,Loop *loop)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = Func::GetSourceContextId(this->func);
  uVar3 = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,CopyPropPhase,uVar2,uVar3);
  if (!bVar1) {
    uVar2 = Func::GetSourceContextId(this->func);
    uVar3 = Func::GetLocalFunctionId(this->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,FieldCopyPropPhase,uVar2,uVar3);
    if (bVar1) {
      return true;
    }
    uVar2 = Func::GetSourceContextId(this->func);
    uVar3 = Func::GetLocalFunctionId(this->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FieldCopyPropPhase,uVar2,uVar3);
    if (!bVar1) {
      bVar1 = DoFieldOpts(this,loop);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::DoFieldCopyProp(Loop * loop) const
{
    if (PHASE_OFF(Js::CopyPropPhase, this->func))
    {
        // Can't do field copy prop without copy prop
        return false;
    }

    if (PHASE_FORCE(Js::FieldCopyPropPhase, this->func))
    {
        // Force always turns on field copy prop
        return true;
    }

    if (PHASE_OFF(Js::FieldCopyPropPhase, this->func))
    {
        return false;
    }

    return this->DoFieldOpts(loop);
}